

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  int iVar3;
  ImGuiContext *g;
  float *pfVar4;
  int iVar5;
  uint uVar6;
  ulong idx;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  
  pIVar1 = GImGui;
  idx = (ulong)(flags & 1);
  uVar6 = data_type & 0xfffffffe;
  bVar7 = uVar6 == 8;
  bVar8 = power != 1.0;
  fVar10 = ImVec2::operator[](&bb->Max,idx);
  fVar11 = ImVec2::operator[](&bb->Min,idx);
  uVar2 = v_min - v_max;
  uVar9 = -uVar2;
  if (0 < (int)uVar2) {
    uVar9 = uVar2;
  }
  fVar11 = (fVar10 - fVar11) + -4.0;
  fVar10 = (pIVar1->Style).GrabMinSize;
  if (uVar6 != 8) {
    fVar12 = fVar11 / (float)(int)(uVar9 + 1);
    uVar2 = -(uint)(fVar10 <= fVar12);
    fVar10 = (float)(~uVar2 & (uint)fVar10 | (uint)fVar12 & uVar2);
  }
  if (fVar11 <= fVar10) {
    fVar10 = fVar11;
  }
  fVar12 = ImVec2::operator[](&bb->Min,idx);
  fVar13 = ImVec2::operator[](&bb->Max,idx);
  fVar17 = (float)v_min;
  if (v_max * v_min < 0 && (bVar8 && bVar7)) {
    fVar14 = fVar17;
    if (v_min < 0) {
      fVar14 = -fVar17;
    }
    fVar14 = powf(fVar14,1.0 / power);
    fVar15 = (float)v_max;
    if (v_max < 0) {
      fVar15 = -fVar15;
    }
    fVar15 = powf(fVar15,1.0 / power);
    fVar14 = fVar14 / (fVar15 + fVar14);
  }
  else if (v_min < 0) {
    fVar14 = 1.0;
  }
  else {
    fVar14 = 0.0;
  }
  fVar12 = fVar12 + 2.0 + fVar10 * 0.5;
  if (pIVar1->ActiveId == id) {
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar16 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar15 = IVar16.x;
      if (idx != 0) {
        fVar15 = -IVar16.y;
      }
      if ((pIVar1->NavActivatePressedId == id) && (pIVar1->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar15 != 0.0) || (NAN(fVar15))) {
        fVar18 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar14);
        if ((uVar6 != 8) ||
           (iVar5 = ImParseFormatPrecision(format,3), (bool)(~(bVar8 && bVar7) & iVar5 < 1))) {
          if ((uVar9 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar15 = *(float *)(&DAT_001954e8 + (ulong)(fVar15 < 0.0) * 4) / (float)(int)uVar9;
          }
          else {
            fVar15 = fVar15 / 100.0;
          }
        }
        else {
          fVar15 = fVar15 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar15 = fVar15 / 10.0;
          }
        }
        uVar9 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar15 = (float)(~uVar9 & (uint)fVar15 | (uint)(fVar15 * 10.0) & uVar9);
        if ((1.0 <= fVar18) && (0.0 < fVar15)) {
          bVar8 = false;
          goto LAB_001553c5;
        }
        if ((fVar18 <= 0.0) && (fVar15 < 0.0)) {
          bVar8 = false;
          goto LAB_001553c5;
        }
        fVar18 = fVar18 + fVar15;
        fVar15 = 1.0;
        if (fVar18 <= 1.0) {
          fVar15 = fVar18;
        }
        fVar15 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar15);
        goto LAB_00155299;
      }
      bVar8 = false;
      goto LAB_001553c5;
    }
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar1->IO).MouseDown[0] == false) {
        ClearActiveID();
        bVar8 = false;
        goto LAB_001553c5;
      }
      pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,idx);
      fVar15 = 0.0;
      if (0.0 < fVar11 - fVar10) {
        fVar18 = (*pfVar4 - fVar12) / (fVar11 - fVar10);
        fVar15 = 1.0;
        if (fVar18 <= 1.0) {
          fVar15 = fVar18;
        }
        fVar15 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar15);
      }
      if (idx != 0) {
        fVar15 = 1.0 - fVar15;
      }
LAB_00155299:
      if (bVar8 && bVar7) {
        if (fVar14 <= fVar15) {
          uVar9 = -(uint)(1e-06 < ABS(fVar14 + -1.0));
          fVar17 = powf((float)(~uVar9 & (uint)fVar15 |
                               (uint)((fVar15 - fVar14) / (1.0 - fVar14)) & uVar9),power);
          uVar9 = 0;
          iVar5 = v_max;
          if (0 < v_min) {
            uVar9 = v_min;
          }
        }
        else {
          fVar17 = powf(1.0 - fVar15 / fVar14,power);
          uVar9 = v_max >> 0x1f & v_max;
          iVar5 = v_min;
        }
        iVar5 = (int)((float)(int)(iVar5 - uVar9) * fVar17 + (float)(int)uVar9);
      }
      else if (uVar6 == 8) {
        iVar5 = (int)((float)(v_max - v_min) * fVar15 + fVar17);
      }
      else {
        fVar15 = fVar15 * (float)(v_max - v_min);
        iVar3 = (int)fVar15;
        iVar5 = (int)(fVar15 + 0.5);
        if (iVar5 < iVar3) {
          iVar5 = iVar3;
        }
        iVar5 = iVar5 + v_min;
      }
      iVar5 = RoundScalarWithFormatT<int,int>(format,data_type,iVar5);
      bVar8 = *v != iVar5;
      if (bVar8) {
        *v = iVar5;
      }
      goto LAB_001553c5;
    }
  }
  bVar8 = false;
LAB_001553c5:
  if (1.0 <= fVar11) {
    fVar11 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar14);
    if (idx != 0) {
      fVar11 = 1.0 - fVar11;
    }
    fVar12 = (((fVar13 + -2.0) - fVar10 * 0.5) - fVar12) * fVar11 + fVar12;
    if (idx == 0) {
      fVar11 = (bb->Min).y;
      fVar13 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar10 * 0.5 + fVar12;
      (out_grab_bb->Min).y = fVar11 + 2.0;
      (out_grab_bb->Max).x = fVar10 * 0.5 + fVar12;
      (out_grab_bb->Max).y = fVar13 + -2.0;
    }
    else {
      fVar11 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar10 * 0.5 + fVar12;
      (out_grab_bb->Max).x = fVar11 + -2.0;
      (out_grab_bb->Max).y = fVar10 * 0.5 + fVar12;
    }
  }
  else {
    IVar16 = bb->Min;
    out_grab_bb->Min = IVar16;
    out_grab_bb->Max = IVar16;
  }
  return bVar8;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}